

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_unittest.cc
# Opt level: O1

void __thiscall
Test_Template_TemplateCache::Test_Template_TemplateCache(Test_Template_TemplateCache *this)

{
  _func_void *local_8;
  
  local_8 = Run;
  if (g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<void(*)(),std::allocator<void(*)()>>::_M_realloc_insert<void(*)()>
              ((vector<void(*)(),std::allocator<void(*)()>> *)&g_testlist,
               (iterator)
               g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_8);
  }
  else {
    *g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
     super__Vector_impl_data._M_finish = Run;
    g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
    super__Vector_impl_data._M_finish =
         g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  return;
}

Assistant:

TEST(Template, TemplateCache) {
  const string filename_a = StringToTemplateFile("Test template 1");
  const string filename_b = StringToTemplateFile("Test template 2.");

  Template *tpl, *tpl2;
  ASSERT(tpl = Template::GetTemplate(filename_a, DO_NOT_STRIP));

  ASSERT(tpl2 = Template::GetTemplate(filename_b, DO_NOT_STRIP));
  ASSERT(tpl2 != tpl);  // different filenames.
  ASSERT(tpl2 = Template::GetTemplate(filename_a, STRIP_BLANK_LINES));
  ASSERT(tpl2 != tpl);  // different strip.
  ASSERT(tpl2 = Template::GetTemplate(filename_b, STRIP_BLANK_LINES));
  ASSERT(tpl2 != tpl);  // different filenames and strip.
  ASSERT(tpl2 = Template::GetTemplate(filename_a, DO_NOT_STRIP));
  ASSERT(tpl2 == tpl);  // same filename and strip.
}